

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::NewScObjectNoArgNoCtorCommon
              (Var instance,ScriptContext *requestContext,bool isBaseClassConstructorNewScObject)

{
  code *pcVar1;
  bool bVar2;
  RecyclableObject *function;
  FunctionInfo *functionInfo_00;
  undefined4 *puVar3;
  Var local_38;
  FunctionInfo *functionInfo;
  RecyclableObject *object;
  bool isBaseClassConstructorNewScObject_local;
  ScriptContext *requestContext_local;
  Var instance_local;
  
  function = VarTo<Js::RecyclableObject>(instance);
  functionInfo_00 = GetConstructorFunctionInfo(instance,requestContext);
  if (functionInfo_00 == (FunctionInfo *)JavascriptObject::EntryInfo::NewInstance) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x18a5,
                                "(functionInfo != &JavascriptObject::EntryInfo::NewInstance)",
                                "functionInfo != &JavascriptObject::EntryInfo::NewInstance");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (functionInfo_00 == (FunctionInfo *)Js::JavascriptArray::EntryInfo::NewInstance) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x18a6,"(functionInfo != &JavascriptArray::EntryInfo::NewInstance)"
                                ,"functionInfo != &JavascriptArray::EntryInfo::NewInstance");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (functionInfo_00 == (FunctionInfo *)0x0) {
    local_38 = NewScObjectHostDispatchOrProxy(function,requestContext);
  }
  else {
    local_38 = NewScObjectCommon(function,functionInfo_00,requestContext,
                                 isBaseClassConstructorNewScObject);
  }
  return local_38;
}

Assistant:

Var JavascriptOperators::NewScObjectNoArgNoCtorCommon(Var instance, ScriptContext* requestContext, bool isBaseClassConstructorNewScObject)
    {
        RecyclableObject * object = VarTo<RecyclableObject>(instance);
        FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(instance, requestContext);
        Assert(functionInfo != &JavascriptObject::EntryInfo::NewInstance); // built-ins are not inlined
        Assert(functionInfo != &JavascriptArray::EntryInfo::NewInstance); // built-ins are not inlined

        return functionInfo != nullptr ?
            JavascriptOperators::NewScObjectCommon(object, functionInfo, requestContext, isBaseClassConstructorNewScObject) :
            JavascriptOperators::NewScObjectHostDispatchOrProxy(object, requestContext);
    }